

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

uint8 * google::protobuf::internal::WireFormatLite::
        InternalWriteMessageNoVirtualToArray<google::protobuf::SourceCodeInfo>
                  (int field_number,SourceCodeInfo *value,bool deterministic,uint8 *target)

{
  uint32 value_00;
  uint8 *puVar1;
  uint8 *target_local;
  bool deterministic_local;
  SourceCodeInfo *value_local;
  int field_number_local;
  
  puVar1 = WriteTagToArray(field_number,WIRETYPE_LENGTH_DELIMITED,target);
  value_00 = SourceCodeInfo::GetCachedSize(value);
  puVar1 = io::CodedOutputStream::WriteVarint32ToArray(value_00,puVar1);
  puVar1 = SourceCodeInfo::InternalSerializeWithCachedSizesToArray(value,deterministic,puVar1);
  return puVar1;
}

Assistant:

inline uint8* WireFormatLite::InternalWriteMessageNoVirtualToArray(
    int field_number, const MessageType_WorkAroundCppLookupDefect& value,
    bool deterministic, uint8* target) {
  target = WriteTagToArray(field_number, WIRETYPE_LENGTH_DELIMITED, target);
  target = io::CodedOutputStream::WriteVarint32ToArray(
    value.MessageType_WorkAroundCppLookupDefect::GetCachedSize(), target);
  return value.MessageType_WorkAroundCppLookupDefect::
      InternalSerializeWithCachedSizesToArray(deterministic, target);
}